

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void * __thiscall
google::protobuf::internal::GeneratedMessageReflection::MutableRawRepeatedField
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,CppType cpptype,
          int ctype,Descriptor *desc)

{
  int *piVar1;
  LogMessage *pLVar2;
  ExtensionSet *this_00;
  void *pvVar3;
  char *pcVar4;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int __c;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *pFVar5;
  LogFinisher local_69;
  LogMessage local_68;
  
  pFVar5 = field;
  pLVar2 = (LogMessage *)message;
  if (*(int *)(field + 0x30) != 3) {
    pLVar2 = (LogMessage *)field;
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"\"MutableRawRepeatedField\"",
               "Field is singular; the method requires a repeated field.");
    pFVar5 = extraout_RDX;
  }
  __c = (int)pFVar5;
  if (*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) !=
      cpptype) {
    pLVar2 = (LogMessage *)field;
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableRawRepeatedField",cpptype);
    __c = extraout_EDX;
  }
  if ((-1 < ctype) && (*(int *)(*(long *)(field + 0x60) + 0x40) != ctype)) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
               ,0x455);
    pLVar2 = LogMessage::operator<<
                       (&local_68,"CHECK failed: (field->options().ctype()) == (ctype): ");
    pLVar2 = LogMessage::operator<<(pLVar2,"subtype mismatch");
    LogFinisher::operator=(&local_69,pLVar2);
    LogMessage::~LogMessage(&local_68);
    __c = extraout_EDX_00;
  }
  if ((desc != (Descriptor *)0x0) && (*(Descriptor **)(field + 0x48) != desc)) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
               ,0x457);
    pLVar2 = LogMessage::operator<<(&local_68,"CHECK failed: (field->message_type()) == (desc): ");
    pLVar2 = LogMessage::operator<<(pLVar2,"wrong submessage type");
    LogFinisher::operator=(&local_69,pLVar2);
    LogMessage::~LogMessage(&local_68);
    __c = extraout_EDX_01;
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    this_00 = MutableExtensionSet(this,message);
    pvVar3 = ExtensionSet::MutableRawRepeatedField(this_00,*(int *)(field + 0x28));
  }
  else {
    piVar1 = this->offsets_;
    pcVar4 = FieldDescriptor::index(field,(char *)pLVar2,__c);
    pvVar3 = (void *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                     (long)piVar1[(int)pcVar4]);
  }
  return pvVar3;
}

Assistant:

void* GeneratedMessageReflection::MutableRawRepeatedField(
    Message* message, const FieldDescriptor* field,
    FieldDescriptor::CppType cpptype,
    int ctype, const Descriptor* desc) const {
  USAGE_CHECK_REPEATED("MutableRawRepeatedField");
  if (field->cpp_type() != cpptype)
    ReportReflectionUsageTypeError(descriptor_,
        field, "MutableRawRepeatedField", cpptype);
  if (ctype >= 0)
    GOOGLE_CHECK_EQ(field->options().ctype(), ctype) << "subtype mismatch";
  if (desc != NULL)
    GOOGLE_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension())
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number());
  else
    return reinterpret_cast<uint8*>(message) + offsets_[field->index()];
}